

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-window.cc
# Opt level: O0

void __thiscall Debugger::MemoryWindow::MemoryWindow(MemoryWindow *this,Debugger *d)

{
  _func_u8_u8_ptr_size_t_void_ptr *p_Var1;
  _func_void_u8_ptr_size_t_u8_void_ptr *p_Var2;
  __1 local_1a;
  __0 local_19;
  Debugger *local_18;
  Debugger *d_local;
  MemoryWindow *this_local;
  
  local_18 = d;
  d_local = (Debugger *)this;
  Window::Window(&this->super_Window,d);
  *(undefined4 *)&(this->super_Window).field_0xc = 0;
  MemoryEditor::MemoryEditor(&this->memory_editor);
  this->memory_editor_base = 0;
  (this->memory_editor).FnUserData = this;
  p_Var1 = MemoryWindow(Debugger*)::$_0::operator_cast_to_function_pointer(&local_19);
  (this->memory_editor).ReadFn = (_func_ImU8_ImU8_ptr_size_t_void_ptr *)p_Var1;
  p_Var2 = MemoryWindow(Debugger*)::$_1::operator_cast_to_function_pointer(&local_1a);
  (this->memory_editor).WriteFn = (_func_void_ImU8_ptr_size_t_ImU8_void_ptr *)p_Var2;
  return;
}

Assistant:

Debugger::MemoryWindow::MemoryWindow(Debugger* d) : Window(d) {
  memory_editor.FnUserData = this;
  memory_editor.ReadFn = [](const u8*, size_t addr, void* user_data) {
    MemoryWindow* this_ = static_cast<MemoryWindow*>(user_data);
    return emulator_read_u8_raw(this_->d->e, this_->memory_editor_base + addr);
  };
  memory_editor.WriteFn = [](u8*, size_t addr, u8 value, void* user_data) {
    MemoryWindow* this_ = static_cast<MemoryWindow*>(user_data);
    emulator_write_u8_raw(this_->d->e, this_->memory_editor_base + addr, value);
  };
}